

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::setCapacity
          (Vector<capnp::compiler::NodeTranslator::UnfinishedValue> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> newBuilder;
  size_t newSize_local;
  Vector<capnp::compiler::NodeTranslator::UnfinishedValue> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)
           ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>
            ((ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> *)local_38,
             (size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>>(&this->builder);
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::
  addAll<kj::ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>>
            ((ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>>
                     ((ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> *)local_38);
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::operator=(&this->builder,pAVar2);
  ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::~ArrayBuilder
            ((ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }